

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_impl.cpp
# Opt level: O2

void __thiscall
icu_63::numparse::impl::NumberParserImpl::NumberParserImpl
          (NumberParserImpl *this,parse_flags_t parseFlags)

{
  (this->super_MutableMatcherCollection)._vptr_MutableMatcherCollection =
       (_func_int **)&PTR__NumberParserImpl_003e0d68;
  this->fParseFlags = parseFlags;
  this->fNumMatchers = 0;
  (this->fMatchers).ptr = (this->fMatchers).stackArray;
  (this->fMatchers).capacity = 10;
  (this->fMatchers).needToRelease = '\0';
  this->fFrozen = false;
  {unnamed_type#1}::NumberParserImpl((_unnamed_type_1_ *)&this->fLocalMatchers);
  {unnamed_type#2}::NumberParserImpl(&this->fLocalValidators);
  return;
}

Assistant:

NumberParserImpl::NumberParserImpl(parse_flags_t parseFlags)
        : fParseFlags(parseFlags) {
}